

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

uc_err reg_write_mips(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint uVar1;
  ulong uVar2;
  uc_err uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (regid - 2 < 0x20) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4) = *value;
  }
  else {
    uVar3 = UC_ERR_ARG;
    switch(regid) {
    case 0x81:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x84) = *value;
      break;
    case 0x82:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x94) = *value;
      break;
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
      goto switchD_0068c446_caseD_83;
    case 0x89:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x570) = *value;
      break;
    case 0x8a:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0xd4) = *value;
      break;
    case 0x8b:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      uVar1 = *value;
      *(uint *)((long)_env + 0x53c) = uVar1;
      uVar4 = *(uint *)((long)_env + 0x2b94);
      uVar5 = uVar4 & 0xc8a7fd04;
      *(uint *)((long)_env + 0x2b94) = uVar5;
      uVar6 = 0x10000000;
      if ((uVar1 & 4) == 0) {
        if ((uVar4 & 4) == 0 && (uVar1 & 2) == 0) {
          uVar6 = uVar1 >> 3 & 3;
          goto LAB_0068c4cf;
        }
      }
      else {
LAB_0068c4cf:
        uVar5 = uVar5 | uVar6;
        *(uint *)((long)_env + 0x2b94) = uVar5;
      }
      if ((((uVar1 >> 0x1c & 1) != 0) && ((*(byte *)((long)_env + 0x2bb1) & 0x20) == 0)) ||
         ((uVar5 & 3) == 0)) {
        uVar5 = uVar5 | 0x10;
        *(uint *)((long)_env + 0x2b94) = uVar5;
      }
      uVar4 = uVar1 >> 0x14 & 0x40 | uVar1 >> 0x18 & 0x20 | uVar5;
      if ((uVar1 & 0x24000000) != 0) {
        *(uint *)((long)_env + 0x2b94) = uVar4;
      }
      if (((uVar5 & 3) != 0) && ((*(byte *)((long)_env + 0x57c) & 0x40) != 0)) {
        uVar4 = uVar4 | 0x400000;
        *(uint *)((long)_env + 0x2b94) = uVar4;
      }
      uVar2 = *(ulong *)((long)_env + 0x2bb0);
      if ((uVar2 >> 0x25 & 1) == 0) {
        if ((uVar2 >> 0x24 & 1) != 0) {
          uVar5 = 0x180000;
          goto LAB_0068c5d6;
        }
        uVar5 = 0x80000;
        if ((uVar1 >> 0x18 & 1) != 0 && (uVar2 >> 0x23 & 1) != 0) goto LAB_0068c5dc;
      }
      else {
        uVar5 = 0x20180000;
LAB_0068c5d6:
        if ((uVar1 >> 0x18 & 1) != 0) {
LAB_0068c5dc:
          uVar4 = uVar4 | uVar5;
          *(uint *)((long)_env + 0x2b94) = uVar4;
        }
      }
      if ((uVar2 & 0x40) == 0) {
        if (((uVar2 & 0x20) != 0) || (-1 < (int)uVar1 || (uVar2 & 8) == 0)) goto LAB_0068c61a;
      }
      else if ((*(byte *)((long)_env + 0x432) & 0x40) == 0) goto LAB_0068c61a;
      uVar4 = uVar4 | 0x80;
      *(uint *)((long)_env + 0x2b94) = uVar4;
LAB_0068c61a:
      if (((uVar2 >> 0x29 & 1) != 0) && ((*(byte *)((long)_env + 0x57f) & 8) != 0)) {
        uVar4 = uVar4 | 0x1000000;
        *(uint *)((long)_env + 0x2b94) = uVar4;
      }
      if (((*(byte *)((long)_env + 0x433) & 0x20) != 0) &&
         ((*(byte *)((long)_env + 0x57d) & 1) != 0)) {
        uVar4 = uVar4 | 0x2000000;
        *(uint *)((long)_env + 0x2b94) = uVar4;
      }
      if ((*(byte *)((long)_env + 0x570) & 0x80) == 0) {
        return UC_ERR_OK;
      }
      if ((*(byte *)((long)_env + 0x4b7) & 0x20) == 0) {
        return UC_ERR_OK;
      }
      *(uint *)((long)_env + 0x2b94) = uVar4 | 0x4000000;
      return UC_ERR_OK;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x80) = *value;
      *setpc = 1;
    }
  }
  uVar3 = UC_ERR_OK;
switchD_0068c446_caseD_83:
  return uVar3;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        env->active_tc.gpr[regid - UC_MIPS_REG_0] = *(mipsreg_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.HI[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.LO[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.PC = *(mipsreg_t *)value;
            *setpc = 1;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Config3 = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            // TODO: ALL CP0 REGS
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00090-2B-MIPS32PRA-AFP-06.02.pdf
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00582-2B-microMIPS32-AFP-05.04.pdf
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Status = *(mipsreg_t *)value;
            compute_hflags(env);
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.CP0_UserLocal = *(mipsreg_t *)value;
            break;
        }
    }

    return ret;
}